

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O0

void solver2_logging_order_rec(sat_solver2 *s,int x)

{
  uint uVar1;
  int iVar2;
  clause *pcVar3;
  bool bVar4;
  int local_28;
  int local_24;
  int y;
  int i;
  clause *c;
  int x_local;
  sat_solver2 *s_local;
  
  uVar1 = var_tag(s,x);
  if ((uVar1 & 8) == 0) {
    iVar2 = var_reason(s,x);
    pcVar3 = clause2_read(s,iVar2);
    local_24 = 1;
    while( true ) {
      bVar4 = false;
      if (local_24 < (int)((uint)*pcVar3 >> 0xb)) {
        local_28 = lit_var((lit)pcVar3[(long)local_24 + 1]);
        bVar4 = local_28 != 0;
      }
      if (!bVar4) break;
      iVar2 = var_level(s,local_28);
      if ((iVar2 != 0) && (uVar1 = var_tag(s,local_28), (uVar1 & 1) == 0)) {
        solver2_logging_order_rec(s,local_28);
      }
      local_24 = local_24 + 1;
    }
    var_add_tag(s,x,8);
    veci_push(&s->min_step_order,x);
  }
  return;
}

Assistant:

static void solver2_logging_order_rec(sat_solver2* s, int x)
{
    clause* c;
    int i, y;
    if ( (var_tag(s,x) & 8) )
        return;
    c = clause2_read(s, var_reason(s,x));
    clause_foreach_var( c, y, i, 1 )
        if ( var_level(s,y) && (var_tag(s,y) & 1) == 0 )
            solver2_logging_order_rec(s, y);
    var_add_tag(s, x, 8);
    veci_push(&s->min_step_order, x);
}